

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationWeights::incWeightByOffset
          (CollationWeights *this,uint32_t weight,int32_t length,int32_t offset)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  iVar8 = length * 8;
  iVar9 = length * -8 + 0x20;
  bVar4 = (byte)iVar9;
  bVar7 = (byte)iVar8;
  uVar3 = (weight >> (-bVar7 & 0x1f) & 0xff) + offset;
  lVar10 = (long)length;
  if (this->maxBytes[lVar10] < uVar3) {
    uVar5 = this->maxBytes[lVar10];
    do {
      uVar1 = this->minBytes[lVar10];
      lVar2 = lVar10 + 4;
      iVar6 = (uVar5 - uVar1) + 1;
      uVar5 = 0xffffffff >> ((byte)iVar8 & 0x1f);
      if (3 < lVar10) {
        uVar5 = 0;
      }
      weight = (int)(uVar3 - uVar1) % iVar6 + uVar1 << ((byte)iVar9 & 0x1f) |
               (-0x100 << ((byte)iVar9 & 0x1f) | uVar5) & weight;
      iVar9 = iVar9 + 8;
      bVar4 = (byte)iVar9;
      lVar10 = lVar10 + -1;
      uVar3 = (weight >> (bVar4 & 0x1f) & 0xff) + (int)(uVar3 - uVar1) / iVar6;
      iVar8 = iVar8 + -8;
      bVar7 = (byte)iVar8;
      uVar5 = this->minBytes[lVar2];
    } while (this->minBytes[lVar2] < uVar3);
    length = (int32_t)lVar10;
  }
  uVar5 = 0;
  if (length < 4) {
    uVar5 = 0xffffffff >> (bVar7 & 0x1f);
  }
  return uVar3 << (bVar4 & 0x1f) | (-0x100 << (bVar4 & 0x1f) | uVar5) & weight;
}

Assistant:

uint32_t
CollationWeights::incWeightByOffset(uint32_t weight, int32_t length, int32_t offset) const {
    for(;;) {
        offset += getWeightByte(weight, length);
        if((uint32_t)offset <= maxBytes[length]) {
            return setWeightByte(weight, length, offset);
        } else {
            // Split the offset between this byte and the previous one.
            offset -= minBytes[length];
            weight = setWeightByte(weight, length, minBytes[length] + offset % countBytes(length));
            offset /= countBytes(length);
            --length;
            U_ASSERT(length > 0);
        }
    }
}